

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugRenderKeyboardPreview(ImDrawList *draw_list)

{
  bool bVar1;
  ImGuiContext *g;
  long lVar2;
  float fVar3;
  float fVar4;
  ImVec2 key_min;
  ImVec2 key_max;
  ImVec2 board_min;
  ImVec2 local_108;
  float local_fc;
  undefined1 local_f8 [8];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ImVec2 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  fVar4 = GImGui->FontSize / 13.0;
  fVar3 = fVar4 * 35.0;
  local_e8 = (GImGui->CurrentWindow->DC).CursorPos;
  _local_f8 = ZEXT416((uint)fVar4);
  local_48 = ZEXT416((uint)fVar3);
  local_d8 = fVar3 + -1.0;
  local_58 = CONCAT44(fVar3 * 0.0,fVar4 * 9.0);
  uStack_50 = 0;
  fVar3 = fVar4 * 9.0 * 2.0 + local_e8.x + local_d8 * 3.0 + 10.0;
  fVar4 = local_d8 * 3.0 + local_e8.y + 10.0;
  local_98.y = fVar4;
  local_98.x = fVar3;
  uStack_e0 = 0;
  local_108.y = fVar4 - local_e8.y;
  local_108.x = fVar3 - local_e8.x;
  fStack_d4 = local_d8;
  fStack_d0 = local_d8;
  fStack_cc = local_d8;
  local_90 = local_e8;
  Dummy(&local_108);
  if (((GImGui->LastItemData).StatusFlags & 0x100) != 0) {
    local_88 = (float)local_f8._0_4_ * 5.0;
    fStack_84 = (float)local_f8._0_4_ * 3.0;
    fStack_80 = (float)local_f8._0_4_ * 0.0;
    fStack_7c = (float)local_f8._0_4_ * 0.0;
    local_78 = (float)local_f8._0_4_ + (float)local_f8._0_4_;
    uStack_74 = local_f8._4_4_;
    uStack_70 = uStack_f0;
    uStack_6c = uStack_ec;
    local_68 = (float)local_f8._0_4_ * 7.0;
    fStack_64 = (float)local_f8._0_4_ * 4.0;
    fStack_60 = (float)local_f8._0_4_ * 0.0;
    fStack_5c = (float)local_f8._0_4_ * 0.0;
    local_fc = (local_e8.x + 5.0) - local_d8;
    local_f8._0_4_ = (float)local_f8._0_4_ * 25.0;
    ImDrawList::PushClipRect(draw_list,&local_90,&local_98,true);
    local_c8 = fStack_84;
    fStack_c4 = fStack_84;
    fStack_c0 = fStack_84;
    fStack_bc = fStack_84;
    local_f8._4_4_ = local_f8._0_4_;
    uStack_f0 = local_f8._0_4_;
    uStack_ec = local_f8._0_4_;
    lVar2 = 0x10;
    local_e8.x = local_e8.y;
    uStack_e0 = CONCAT44(local_e8.y,local_e8.y);
    fVar3 = local_e8.y;
    do {
      fVar4 = (float)*(int *)((long)&GLocalizationEntriesEnUS[8].Key + lVar2);
      local_108.x = fVar4 * (float)local_58 +
                    (float)*(int *)(&GLocalizationEntriesEnUS[8].field_0x4 + lVar2) * local_d8 +
                    local_fc;
      local_108.y = fVar4 * local_d8 + fVar3;
      local_a0.y = local_108.y + (float)local_48._0_4_;
      local_a0.x = local_108.x + (float)local_48._0_4_;
      ImDrawList::AddRectFilled(draw_list,&local_108,&local_a0,0xffcccccc,local_c8,0);
      ImDrawList::AddRect(draw_list,&local_108,&local_a0,0xff181818,local_c8,0,1.0);
      local_a8.y = local_108.y + fStack_84;
      local_a8.x = local_108.x + local_88;
      local_b0.y = local_108.y + fStack_84 + (float)local_f8._4_4_;
      local_b0.x = local_108.x + local_88 + (float)local_f8._0_4_;
      ImDrawList::AddRect(draw_list,&local_a8,&local_b0,0xffc1c1c1,local_78,0,2.0);
      ImDrawList::AddRectFilled(draw_list,&local_a8,&local_b0,0xfffcfcfc,local_78,0);
      local_b8.y = local_108.y + fStack_64;
      local_b8.x = local_108.x + local_68;
      ImDrawList::AddText(draw_list,&local_b8,0xff404040,
                          *(char **)((long)&GLocalizationEntriesEnUS[8].Text + lVar2),(char *)0x0);
      bVar1 = IsKeyDown(*(ImGuiKey *)((long)&DAT_0022e800 + lVar2),0);
      if (bVar1) {
        ImDrawList::AddRectFilled(draw_list,&local_108,&local_a0,0x800000ff,local_c8,0);
      }
      lVar2 = lVar2 + 0x18;
      fVar3 = local_e8.x;
    } while (lVar2 != 0x178);
    ImDrawList::PopClipRect(draw_list);
  }
  return;
}

Assistant:

void ImGui::DebugRenderKeyboardPreview(ImDrawList* draw_list)
{
    const float scale = ImGui::GetFontSize() / 13.0f;
    const ImVec2 key_size = ImVec2(35.0f, 35.0f) * scale;
    const float  key_rounding = 3.0f * scale;
    const ImVec2 key_face_size = ImVec2(25.0f, 25.0f) * scale;
    const ImVec2 key_face_pos = ImVec2(5.0f, 3.0f) * scale;
    const float  key_face_rounding = 2.0f * scale;
    const ImVec2 key_label_pos = ImVec2(7.0f, 4.0f) * scale;
    const ImVec2 key_step = ImVec2(key_size.x - 1.0f, key_size.y - 1.0f);
    const float  key_row_offset = 9.0f * scale;

    ImVec2 board_min = GetCursorScreenPos();
    ImVec2 board_max = ImVec2(board_min.x + 3 * key_step.x + 2 * key_row_offset + 10.0f, board_min.y + 3 * key_step.y + 10.0f);
    ImVec2 start_pos = ImVec2(board_min.x + 5.0f - key_step.x, board_min.y);

    struct KeyLayoutData { int Row, Col; const char* Label; ImGuiKey Key; };
    const KeyLayoutData keys_to_display[] =
    {
        { 0, 0, "", ImGuiKey_Tab },      { 0, 1, "Q", ImGuiKey_Q }, { 0, 2, "W", ImGuiKey_W }, { 0, 3, "E", ImGuiKey_E }, { 0, 4, "R", ImGuiKey_R },
        { 1, 0, "", ImGuiKey_CapsLock }, { 1, 1, "A", ImGuiKey_A }, { 1, 2, "S", ImGuiKey_S }, { 1, 3, "D", ImGuiKey_D }, { 1, 4, "F", ImGuiKey_F },
        { 2, 0, "", ImGuiKey_LeftShift },{ 2, 1, "Z", ImGuiKey_Z }, { 2, 2, "X", ImGuiKey_X }, { 2, 3, "C", ImGuiKey_C }, { 2, 4, "V", ImGuiKey_V }
    };

    // Elements rendered manually via ImDrawList API are not clipped automatically.
    // While not strictly necessary, here IsItemVisible() is used to avoid rendering these shapes when they are out of view.
    Dummy(board_max - board_min);
    if (!IsItemVisible())
        return;
    draw_list->PushClipRect(board_min, board_max, true);
    for (int n = 0; n < IM_ARRAYSIZE(keys_to_display); n++)
    {
        const KeyLayoutData* key_data = &keys_to_display[n];
        ImVec2 key_min = ImVec2(start_pos.x + key_data->Col * key_step.x + key_data->Row * key_row_offset, start_pos.y + key_data->Row * key_step.y);
        ImVec2 key_max = key_min + key_size;
        draw_list->AddRectFilled(key_min, key_max, IM_COL32(204, 204, 204, 255), key_rounding);
        draw_list->AddRect(key_min, key_max, IM_COL32(24, 24, 24, 255), key_rounding);
        ImVec2 face_min = ImVec2(key_min.x + key_face_pos.x, key_min.y + key_face_pos.y);
        ImVec2 face_max = ImVec2(face_min.x + key_face_size.x, face_min.y + key_face_size.y);
        draw_list->AddRect(face_min, face_max, IM_COL32(193, 193, 193, 255), key_face_rounding, ImDrawFlags_None, 2.0f);
        draw_list->AddRectFilled(face_min, face_max, IM_COL32(252, 252, 252, 255), key_face_rounding);
        ImVec2 label_min = ImVec2(key_min.x + key_label_pos.x, key_min.y + key_label_pos.y);
        draw_list->AddText(label_min, IM_COL32(64, 64, 64, 255), key_data->Label);
        if (IsKeyDown(key_data->Key))
            draw_list->AddRectFilled(key_min, key_max, IM_COL32(255, 0, 0, 128), key_rounding);
    }
    draw_list->PopClipRect();
}